

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observables.hh
# Opt level: O3

double __thiscall SSM::SwitchObservable::convert(SwitchObservable *this,const_iterator input)

{
  byte bVar1;
  int iVar2;
  double dVar3;
  
  bVar1 = *input._M_current;
  iVar2 = (*(this->super_Observable)._vptr_Observable[4])();
  dVar3 = 0.0;
  if ((bVar1 & (byte)(1 << ((byte)iVar2 & 0x1f))) != 0) {
    dVar3 = 1.0;
  }
  return dVar3;
}

Assistant:

double convert(Bytes::const_iterator input) const override
    {
      Byte value = *input;
      Byte bitmask = Byte(0x01) << markerBit();
      return ((value & bitmask) == Byte(0x00)) ? 0.0 : 1.0;
    }